

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3BtreePutData(BtCursor *pCsr,u32 offset,u32 amt,void *z)

{
  int local_30;
  int rc;
  void *z_local;
  u32 amt_local;
  u32 offset_local;
  BtCursor *pCsr_local;
  
  if (pCsr->eState < 3) {
    local_30 = 0;
  }
  else {
    local_30 = btreeRestoreCursorPosition(pCsr);
  }
  if (local_30 == 0) {
    if (pCsr->eState == '\0') {
      saveAllCursors(pCsr->pBt,pCsr->pgnoRoot,pCsr);
      if ((pCsr->curFlags & 1) == 0) {
        pCsr_local._4_4_ = 8;
      }
      else {
        pCsr_local._4_4_ = accessPayload(pCsr,offset,amt,(uchar *)z,1);
      }
    }
    else {
      pCsr_local._4_4_ = 4;
    }
  }
  else {
    pCsr_local._4_4_ = local_30;
  }
  return pCsr_local._4_4_;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreePutData(BtCursor *pCsr, u32 offset, u32 amt, void *z){
  int rc;
  assert( cursorOwnsBtShared(pCsr) );
  assert( sqlite3_mutex_held(pCsr->pBtree->db->mutex) );
  assert( pCsr->curFlags & BTCF_Incrblob );

  rc = restoreCursorPosition(pCsr);
  if( rc!=SQLITE_OK ){
    return rc;
  }
  assert( pCsr->eState!=CURSOR_REQUIRESEEK );
  if( pCsr->eState!=CURSOR_VALID ){
    return SQLITE_ABORT;
  }

  /* Save the positions of all other cursors open on this table. This is
  ** required in case any of them are holding references to an xFetch
  ** version of the b-tree page modified by the accessPayload call below.
  **
  ** Note that pCsr must be open on a INTKEY table and saveCursorPosition()
  ** and hence saveAllCursors() cannot fail on a BTREE_INTKEY table, hence
  ** saveAllCursors can only return SQLITE_OK.
  */
  VVA_ONLY(rc =) saveAllCursors(pCsr->pBt, pCsr->pgnoRoot, pCsr);
  assert( rc==SQLITE_OK );

  /* Check some assumptions:
  **   (a) the cursor is open for writing,
  **   (b) there is a read/write transaction open,
  **   (c) the connection holds a write-lock on the table (if required),
  **   (d) there are no conflicting read-locks, and
  **   (e) the cursor points at a valid row of an intKey table.
  */
  if( (pCsr->curFlags & BTCF_WriteFlag)==0 ){
    return SQLITE_READONLY;
  }
  assert( (pCsr->pBt->btsFlags & BTS_READ_ONLY)==0
              && pCsr->pBt->inTransaction==TRANS_WRITE );
  assert( hasSharedCacheTableLock(pCsr->pBtree, pCsr->pgnoRoot, 0, 2) );
  assert( !hasReadConflicts(pCsr->pBtree, pCsr->pgnoRoot) );
  assert( pCsr->pPage->intKey );

  return accessPayload(pCsr, offset, amt, (unsigned char *)z, 1);
}